

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_15ef17::RNGState::SeedEvents(RNGState *this,CSHA512 *hasher)

{
  long lVar1;
  uchar *in_RSI;
  CSHA256 *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  uchar events_hash [32];
  CSHA256 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uchar *in_stack_ffffffffffffffd0;
  CSHA256 *in_stack_ffffffffffffffd8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffe0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffffa8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
             (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             SUB41((uint)in_stack_ffffffffffffffc8 >> 0x18,0));
  CSHA256::Finalize(in_RDI,in_RSI);
  CSHA512::Write((CSHA512 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (uchar *)in_RDI,(size_t)in_RSI);
  CSHA256::Reset(in_stack_ffffffffffffffa8);
  CSHA256::Write(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_events_mutex)
    {
        // We use only SHA256 for the events hashing to get the ASM speedups we have for SHA256,
        // since we want it to be fast as network peers may be able to trigger it repeatedly.
        LOCK(m_events_mutex);

        unsigned char events_hash[32];
        m_events_hasher.Finalize(events_hash);
        hasher.Write(events_hash, 32);

        // Re-initialize the hasher with the finalized state to use later.
        m_events_hasher.Reset();
        m_events_hasher.Write(events_hash, 32);
    }